

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  char cVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  bool bVar13;
  ulong uStack_10620;
  __u32 force_tx_stmin;
  ulong uStack_10610;
  ulong uStack_10608;
  sockaddr_can addr;
  uchar buf [67000];
  
  force_tx_stmin = 0;
  addr.can_addr.j1939.name = 0xffffffffffffffff;
  uStack_10620 = 1;
  uVar5 = 0xffffffffffffffff;
  uStack_10610 = 0xffffffff;
  uVar10 = 0;
  uStack_10608 = 0;
  do {
    uVar1 = getopt(argc,argv,"s:d:x:p:P:t:f:D:l:g:bSCL:?");
    pcVar8 = _optarg;
    switch(uVar1) {
    case 0x62:
      main::opts.flags = main::opts.flags | 0x400;
      break;
    case 99:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_001014b7_caseD_63:
      fprintf(_stderr,"Unknown option %c\n",(ulong)uVar1);
LAB_001019fc:
      pcVar8 = __xpg_basename(*argv);
      print_usage(pcVar8);
LAB_00101a0d:
      exit(1);
    case 100:
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      uVar1 = (uint)uVar5;
      addr.can_addr.tp.rx_id = uVar1;
      sVar12 = strlen(_optarg);
      if (7 < sVar12) {
        uVar5 = (ulong)(uVar1 | 0x80000000);
        addr.can_addr.j1939.name = CONCAT44(addr.can_addr.tp.tx_id,uVar1) | 0x80000000;
      }
      break;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x80;
      uVar4 = strtoul(_optarg,(char **)0x0,10);
      force_tx_stmin = (__u32)uVar4;
      break;
    case 0x67:
      uStack_10608 = strtoul(_optarg,(char **)0x0,10);
      break;
    case 0x6c:
      uStack_10620 = 0;
      if ((*_optarg != 'i') &&
         (uStack_10620 = strtoul(_optarg,(char **)0x0,10), (int)uStack_10620 == 0)) {
        fwrite("Invalid argument for option -l!\n",0x20,1,_stderr);
        return 1;
      }
      break;
    case 0x70:
      iVar2 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040d5,0x1040d6);
      if (iVar2 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
      }
      else if (iVar2 == 1) {
        main::opts.flags = main::opts.flags | 4;
      }
      else {
        iVar2 = __isoc99_sscanf(_optarg,":%hhx",0x1040d6);
        if (iVar2 != 1) {
          pcVar8 = "incorrect padding values \'%s\'.\n";
LAB_00101a4a:
          printf(pcVar8,_optarg);
LAB_00101a51:
          pcVar8 = __xpg_basename(*argv);
          print_usage(pcVar8);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 8;
      }
      break;
    case 0x73:
      uStack_10610 = strtoul(_optarg,(char **)0x0,0x10);
      addr.can_addr.tp.tx_id = (canid_t)uStack_10610;
      sVar12 = strlen(_optarg);
      if (7 < sVar12) {
        uVar1 = (uint)uStack_10610;
        uStack_10610 = (ulong)(uVar1 | 0x80000000);
        addr.can_addr.j1939.name = CONCAT44(uVar1,addr.can_addr.tp.rx_id) | 0x8000000000000000;
      }
      break;
    case 0x74:
      iVar2 = strncmp(_optarg,"ZERO",4);
      if (iVar2 == 0) {
        main::opts.frame_txtime = 0xffffffff;
      }
      else {
        uVar4 = strtoul(pcVar8,(char **)0x0,10);
        main::opts.frame_txtime = (__u32)uVar4;
      }
      break;
    default:
      if (uVar1 == 0x43) {
        main::opts.flags = main::opts.flags | 0x1000;
      }
      else if (uVar1 == 0x44) {
        uVar10 = strtoul(_optarg,(char **)0x0,10);
        if (((int)uVar10 == 0) || (66999 < (int)uVar10)) goto LAB_00101a51;
      }
      else if (uVar1 == 0x4c) {
        iVar2 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040d9,0x1040da);
        if (iVar2 != 3) {
          pcVar8 = "unknown link layer options \'%s\'.\n";
          goto LAB_00101a4a;
        }
      }
      else if (uVar1 == 0x50) {
        cVar7 = *_optarg;
        if (cVar7 == 'a') {
          main::opts.flags = main::opts.flags | 0x30;
        }
        else if (cVar7 == 'c') {
          main::opts.flags = main::opts.flags | 0x20;
        }
        else {
          if (cVar7 != 'l') {
            printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)cVar7);
            goto LAB_00101a51;
          }
          main::opts.flags = main::opts.flags | 0x10;
        }
      }
      else if (uVar1 == 0x53) {
        main::opts.flags = main::opts.flags | 0x800;
      }
      else {
        if (uVar1 != 0x78) {
          if (uVar1 == 0xffffffff) {
            if ((((argc - _optind != 1) || ((int)uStack_10610 == -1)) ||
                ((main::opts.flags & 0x1800) == 0x1800)) ||
               (((main::opts.flags & 0x1800) == 0 && ((int)uVar5 == -1)))) goto LAB_001019fc;
            iVar2 = socket(0x1d,2,6);
            if (iVar2 < 0) {
              pcVar8 = "socket";
            }
            else {
              iVar3 = setsockopt(iVar2,0x6a,1,&main::opts,0xc);
              if (iVar3 < 0) {
                pcVar8 = "sockopt";
              }
              else if ((main::llopts.tx_dl == '\0') ||
                      (iVar3 = setsockopt(iVar2,0x6a,5,&main::llopts,3), -1 < iVar3)) {
                if ((main::opts.flags & 0x80) != 0) {
                  setsockopt(iVar2,0x6a,3,&force_tx_stmin,4);
                }
                addr.can_family = 0x1d;
                addr.can_ifindex = if_nametoindex(argv[_optind]);
                if (addr.can_ifindex != 0) {
                  iVar3 = bind(iVar2,(sockaddr *)&addr,0x18);
                  uVar5 = uStack_10608;
                  if (iVar3 < 0) {
                    perror("bind");
                    close(iVar2);
                    goto LAB_00101a0d;
                  }
                  if ((int)uVar10 != 0) {
                    uVar1 = 0;
                    sVar12 = uVar10 & 0xffffffff;
                    if ((int)uVar10 < 1) {
                      sVar12 = 0;
                    }
                    puVar6 = buf;
                    cVar7 = '\x01';
                    sVar9 = sVar12;
                    while( true ) {
                      bVar13 = sVar9 == 0;
                      sVar9 = sVar9 - 1;
                      if (bVar13) break;
                      *puVar6 = (char)((ulong)uVar1 / 0xff) + cVar7;
                      puVar6 = puVar6 + 1;
                      cVar7 = cVar7 + '\x01';
                      uVar1 = uVar1 + 1;
                    }
                    uVar1 = (uint)sVar12;
                    goto LAB_00101929;
                  }
                  uVar10 = 0;
                  goto LAB_001018ef;
                }
                pcVar8 = "if_nametoindex";
              }
              else {
                pcVar8 = "link layer sockopt";
              }
            }
            perror(pcVar8);
            goto LAB_00101a0d;
          }
          if (uVar1 != 0x3f) goto switchD_001014b7_caseD_63;
          goto LAB_00101a51;
        }
        iVar2 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040d4,0x1040d7);
        uVar1 = 2;
        if (iVar2 != 1) {
          if (iVar2 != 2) {
            pcVar8 = "incorrect extended addr values \'%s\'.\n";
            goto LAB_00101a4a;
          }
          uVar1 = 0x202;
        }
        main::opts.flags = main::opts.flags | uVar1;
      }
    }
  } while( true );
LAB_001018ef:
  if (uVar10 == 67000) {
    uVar10 = 67000;
LAB_00101926:
    uVar1 = (uint)uVar10;
    sVar12 = uVar10 & 0xffffffff;
LAB_00101929:
    do {
      if ((__useconds_t)uVar5 != 0) {
        usleep((__useconds_t)uVar5);
      }
      uVar5 = write(iVar2,buf,sVar12);
      uVar11 = (uint)uVar5;
      if ((int)uVar11 < 0) {
        perror("write");
        return uVar11;
      }
      if (uVar1 != uVar11) {
        fprintf(_stderr,"wrote only %d from %d byte\n",uVar5 & 0xffffffff,(ulong)uVar1);
      }
      iVar3 = (int)uStack_10620;
      uStack_10620 = 0;
      uVar5 = uStack_10608;
    } while ((iVar3 == 0) || (uVar11 = iVar3 - 1, uStack_10620 = (ulong)uVar11, uVar11 != 0));
    close(iVar2);
    return 0;
  }
  iVar3 = __isoc99_scanf("%hhx",buf + uVar10);
  if (iVar3 != 1) goto LAB_00101926;
  uVar10 = uVar10 + 1;
  goto LAB_001018ef;
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_ll_options llopts;
    int opt;
    extern int optind, opterr, optopt;
    unsigned int loops = 1; /* one (== no) loop by default */
    useconds_t usecs = 0; /* wait before sending the PDU */
    __u32 force_tx_stmin = 0;
    unsigned char buf[BUFSIZE];
    int buflen = 0;
    int datalen = 0;
    int retval = 0;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:t:f:D:l:g:bSCL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 't':
		    if (!strncmp(optarg, ZERO_STRING, strlen(ZERO_STRING)))
			    opts.frame_txtime = CAN_ISOTP_FRAME_TXTIME_ZERO;
		    else
			    opts.frame_txtime = strtoul(optarg, NULL, 10);
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_TXSTMIN;
		    force_tx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'D':
		    datalen = strtoul(optarg, NULL, 10);
		    if (!datalen || datalen >= BUFSIZE) {
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'l':
		    if (optarg[0] == 'i') {
			    loops = 0; /* infinite loop */
		    } else {
			    loops = strtoul(optarg, NULL, 10);
			    if (!loops) {
				    fprintf(stderr, "Invalid argument for option -l!\n");
				    return 1;
			    }
		    }
		    break;

	    case 'g':
		    usecs = strtoul(optarg, NULL, 10);
		    break;

	    case 'b':
		    opts.flags |= CAN_ISOTP_WAIT_TX_DONE;
		    break;

	    case 'S':
		    opts.flags |= CAN_ISOTP_SF_BROADCAST;
		    break;

	    case 'C':
		    opts.flags |= CAN_ISOTP_CF_BROADCAST;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

#define BC_FLAGS (CAN_ISOTP_SF_BROADCAST | CAN_ISOTP_CF_BROADCAST)

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	((opts.flags & BC_FLAGS) == BC_FLAGS) ||
	((addr.can_addr.tp.rx_id == NO_CAN_ID) &&
	 (!(opts.flags & BC_FLAGS)))) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }

    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts)) < 0) {
	perror("sockopt");
	exit(1);
    }


    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_TXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_TX_STMIN, &force_tx_stmin, sizeof(force_tx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    if (!datalen) {
	    while (buflen < BUFSIZE && scanf("%hhx", &buf[buflen]) == 1)
		    buflen++;
    } else {
	    for (buflen = 0; buflen < datalen; buflen++)
		    buf[buflen] = ((buflen % 0xFF) + 1) & 0xFF;
    }

loop:
    if (usecs)
	    usleep(usecs);

    retval = write(s, buf, buflen);
    if (retval < 0) {
	    perror("write");
	    return retval;
    }

    if (retval != buflen)
	    fprintf(stderr, "wrote only %d from %d byte\n", retval, buflen);

    if (loops) {
	    if (--loops)
		    goto loop;
    } else {
	    goto loop;
    }

    /* 
     * due to a Kernel internal wait queue the PDU is sent completely
     * before close() returns.
     */
    close(s);

    return 0;
}